

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

void Aig_ManMarkValidChoices(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pNode;
  Aig_Obj_t *pOld;
  int i;
  Vec_Ptr_t *p_00;
  ulong uVar3;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                  ,0x1e5,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    __assert_fail("p->pEquivs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                  ,0x1e7,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
  }
  p_00 = p->vObjs;
  uVar3 = (ulong)p_00->nSize;
  ppAVar2 = (Aig_Obj_t **)calloc(1,uVar3 << 3);
  p->pEquivs = ppAVar2;
  i = 0;
  do {
    if ((int)uVar3 <= i) {
      return;
    }
    pNode = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
      pOld = Aig_ObjFindRepr(p,pNode);
      if (pOld != (Aig_Obj_t *)0x0) {
        if (0xfffffffd < (*(uint *)&pOld->field_0x18 & 7) - 7) {
          iVar1 = Aig_ObjCheckTfi(p,pNode,pOld);
          if ((iVar1 == 0) && ((*(uint *)&pNode->field_0x18 & 0xffffffc0) == 0)) {
            iVar1 = pOld->Id;
            p->pEquivs[pNode->Id] = p->pEquivs[iVar1];
            p->pEquivs[iVar1] = pNode;
            goto LAB_0057db0c;
          }
        }
        Aig_ObjClearRepr(p,pNode);
      }
    }
LAB_0057db0c:
    i = i + 1;
    p_00 = p->vObjs;
    uVar3 = (ulong)(uint)p_00->nSize;
  } while( true );
}

Assistant:

void Aig_ManMarkValidChoices( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i;
    assert( p->pReprs != NULL );
    // create equivalent nodes in the manager
    assert( p->pEquivs == NULL );
    p->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    memset( p->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    // make the choice nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindRepr( p, pObj );
        if ( pRepr == NULL )
            continue;
        // skip constant and PI classes
        if ( !Aig_ObjIsNode(pRepr) )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
        // skip choices with combinatinal loops
        if ( Aig_ObjCheckTfi( p, pObj, pRepr ) )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
//printf( "Node %d is represented by node %d.\n", pObj->Id, pRepr->Id );
        // add choice to the choice node
        if ( pObj->nRefs > 0 )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
        assert( pObj->nRefs == 0 );
        p->pEquivs[pObj->Id] = p->pEquivs[pRepr->Id];
        p->pEquivs[pRepr->Id] = pObj;
    }
}